

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O1

void ares_free_query(ares_query_t *query)

{
  ares_slist_node_destroy(query->node_queries_by_timeout);
  ares_llist_node_destroy(query->node_queries_to_conn);
  query->conn = (ares_conn_t *)0x0;
  query->node_queries_by_timeout = (ares_slist_node_t *)0x0;
  query->node_queries_to_conn = (ares_llist_node_t *)0x0;
  ares_htable_szvp_remove(query->channel->queries_by_qid,(ulong)query->qid);
  ares_llist_node_destroy(query->node_all_queries);
  query->node_all_queries = (ares_llist_node_t *)0x0;
  query->callback = (ares_callback_dnsrec)0x0;
  query->arg = (void *)0x0;
  ares_dns_record_destroy(query->query);
  ares_free(query);
  return;
}

Assistant:

void ares_free_query(ares_query_t *query)
{
  ares_detach_query(query);
  /* Zero out some important stuff, to help catch bugs */
  query->callback = NULL;
  query->arg      = NULL;
  /* Deallocate the memory associated with the query */
  ares_dns_record_destroy(query->query);

  ares_free(query);
}